

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
CompilerContext::compile_command(CompilerContext *this,SyntaxTree *command_node,bool not_flag)

{
  Commands *pCVar1;
  Command *command_00;
  bool bVar2;
  ReplacedCommandAnnotation *pRVar3;
  const_reference operand;
  Command *pCVar4;
  ArgList local_c0;
  shared_ptr<Label> local_a8;
  shared_ptr<Label> local_98;
  optional<const_Command_&> local_88;
  Command *local_80;
  Command *local_78;
  Command *command_1;
  ArgList local_60;
  shared_ptr<Label> local_48;
  optional<const_Command_&> local_38;
  Command *local_30;
  Command *command;
  optional<const_ReplacedCommandAnnotation_&> opt_annot;
  bool not_flag_local;
  SyntaxTree *command_node_local;
  CompilerContext *this_local;
  
  opt_annot.ref._7_1_ = not_flag;
  SyntaxTree::maybe_annotation<DummyCommandAnnotation>((SyntaxTree *)((long)&opt_annot.ref + 5));
  bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)((long)&opt_annot.ref + 5))
  ;
  if (!bVar2) {
    SyntaxTree::maybe_annotation<ReplacedCommandAnnotation_const&>((SyntaxTree *)&command);
    bVar2 = std::experimental::optional::operator_cast_to_bool((optional *)&command);
    if (bVar2) {
      pRVar3 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->
                         ((optional<const_ReplacedCommandAnnotation_&> *)&command);
      pCVar4 = pRVar3->command;
      pCVar1 = this->commands;
      local_30 = pCVar4;
      std::experimental::optional<const_Command_&>::optional
                (&local_38,&this->commands->skip_cutscene_start_internal);
      bVar2 = Commands::equal(pCVar1,pCVar4,&local_38);
      if (bVar2) {
        pRVar3 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->
                           ((optional<const_ReplacedCommandAnnotation_&> *)&command);
        operand = std::vector<linb::any,_std::allocator<linb::any>_>::operator[](&pRVar3->params,0);
        linb::any_cast<std::shared_ptr<Label>>((linb *)&local_48,operand);
        std::shared_ptr<Label>::operator=(&this->label_skip_cutscene_end,&local_48);
        std::shared_ptr<Label>::~shared_ptr(&local_48);
      }
      command_00 = local_30;
      pRVar3 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->
                         ((optional<const_ReplacedCommandAnnotation_&> *)&command);
      pCVar4 = pRVar3->command;
      pRVar3 = std::experimental::optional<const_ReplacedCommandAnnotation_&>::operator->
                         ((optional<const_ReplacedCommandAnnotation_&> *)&command);
      get_args(&local_60,this,pCVar4,&pRVar3->params);
      compile_command(this,command_00,&local_60,false);
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector(&local_60);
    }
    else {
      local_80 = (Command *)
                 SyntaxTree::annotation<std::reference_wrapper<Command_const>>(command_node);
      pCVar4 = std::reference_wrapper::operator_cast_to_Command_((reference_wrapper *)&local_80);
      pCVar1 = this->commands;
      local_78 = pCVar4;
      std::experimental::optional<const_Command_&>::optional
                (&local_88,&this->commands->skip_cutscene_end);
      bVar2 = Commands::equal(pCVar1,pCVar4,&local_88);
      if ((bVar2) &&
         (bVar2 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)&this->label_skip_cutscene_end), bVar2)) {
        std::shared_ptr<Label>::shared_ptr(&local_98,&this->label_skip_cutscene_end);
        compile_label(this,&local_98);
        std::shared_ptr<Label>::~shared_ptr(&local_98);
        std::shared_ptr<Label>::shared_ptr(&local_a8,(nullptr_t)0x0);
        std::shared_ptr<Label>::operator=(&this->label_skip_cutscene_end,&local_a8);
        std::shared_ptr<Label>::~shared_ptr(&local_a8);
      }
      pCVar4 = local_78;
      get_args(&local_c0,this,local_78,command_node);
      compile_command(this,pCVar4,&local_c0,(bool)(opt_annot.ref._7_1_ & 1));
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector(&local_c0);
    }
  }
  return;
}

Assistant:

void CompilerContext::compile_command(const SyntaxTree& command_node, bool not_flag)
{
    if(command_node.maybe_annotation<DummyCommandAnnotation>())
    {
        // compile nothing
    }
    else if(auto opt_annot = command_node.maybe_annotation<const ReplacedCommandAnnotation&>())
    {
        const Command& command = opt_annot->command;

        if(commands.equal(command, commands.skip_cutscene_start_internal))
        {
            this->label_skip_cutscene_end = any_cast<shared_ptr<Label>>(opt_annot->params[0]);
        }

        compile_command(command, get_args(opt_annot->command, opt_annot->params));
    }
    else
    {
        const Command& command = command_node.annotation<std::reference_wrapper<const Command>>();

        if(commands.equal(command, commands.skip_cutscene_end) && this->label_skip_cutscene_end)
        {
            compile_label(this->label_skip_cutscene_end);
            this->label_skip_cutscene_end = nullptr;
        }

        compile_command(command, get_args(command, command_node), not_flag);
    }
}